

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O0

void pub0_pipe_recv_cb(void *arg)

{
  nng_err nVar1;
  nni_msg *m;
  pub0_pipe *p;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x228));
  if (nVar1 == NNG_OK) {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x228));
    nni_msg_free(m);
  }
  nni_pipe_close(*arg);
  return;
}

Assistant:

static void
pub0_pipe_recv_cb(void *arg)
{
	pub0_pipe *p = arg;

	// We should never receive a message -- the only valid reason for us to
	// be here is on pipe close.
	if (nni_aio_result(&p->aio_recv) == 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_recv));
	}
	nni_pipe_close(p->pipe);
}